

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::XmlUnitTestResultPrinter::OnTestIterationEnd
          (XmlUnitTestResultPrinter *this,UnitTest *unit_test,int param_3)

{
  bool bVar1;
  undefined8 uVar2;
  stringstream stream;
  UnitTest *in_stack_00000178;
  ostream *in_stack_00000180;
  FilePath output_dir;
  FilePath output_file;
  FILE *xmlout;
  char *in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffda0;
  string *this_00;
  string *in_stack_fffffffffffffda8;
  FILE *pFVar3;
  FilePath *in_stack_fffffffffffffdb0;
  string local_218 [16];
  FilePath *in_stack_fffffffffffffdf8;
  stringstream *in_stack_fffffffffffffe08;
  FilePath *in_stack_fffffffffffffe28;
  FILE *local_20;
  
  local_20 = (FILE *)0x0;
  FilePath::FilePath(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  FilePath::RemoveFileName(in_stack_fffffffffffffe28);
  bVar1 = FilePath::CreateDirectoriesRecursively(in_stack_fffffffffffffdf8);
  if (bVar1) {
    std::__cxx11::string::c_str();
    local_20 = (FILE *)posix::FOpen(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  }
  pFVar3 = _stderr;
  if (local_20 == (FILE *)0x0) {
    uVar2 = std::__cxx11::string::c_str();
    fprintf(pFVar3,"Unable to open file \"%s\"\n",uVar2);
    fflush(_stderr);
    exit(1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe08);
  PrintXmlUnitTest(in_stack_00000180,in_stack_00000178);
  pFVar3 = local_20;
  StringStreamToString(in_stack_fffffffffffffe08);
  this_00 = local_218;
  uVar2 = std::__cxx11::string::c_str();
  fprintf(pFVar3,"%s",uVar2);
  std::__cxx11::string::~string(this_00);
  fclose(local_20);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe08);
  FilePath::~FilePath((FilePath *)0x11c482);
  FilePath::~FilePath((FilePath *)0x11c48f);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                  int /*iteration*/) {
  FILE* xmlout = NULL;
  FilePath output_file(output_file_);
  FilePath output_dir(output_file.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    xmlout = posix::FOpen(output_file_.c_str(), "w");
  }
  if (xmlout == NULL) {
    // TODO(wan): report the reason of the failure.
    //
    // We don't do it for now as:
    //
    //   1. There is no urgent need for it.
    //   2. It's a bit involved to make the errno variable thread-safe on
    //      all three operating systems (Linux, Windows, and Mac OS).
    //   3. To interpret the meaning of errno in a thread-safe way,
    //      we need the strerror_r() function, which is not available on
    //      Windows.
    fprintf(stderr,
            "Unable to open file \"%s\"\n",
            output_file_.c_str());
    fflush(stderr);
    exit(EXIT_FAILURE);
  }
  std::stringstream stream;
  PrintXmlUnitTest(&stream, unit_test);
  fprintf(xmlout, "%s", StringStreamToString(&stream).c_str());
  fclose(xmlout);
}